

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec)

{
  uint *puVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int *piVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_158;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  cpp_dec_float<50U,_int,_void> local_108;
  int *local_d0;
  cpp_dec_float<50U,_int,_void> local_c8;
  int *local_90;
  pointer local_88;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_108.fpclass = cpp_dec_float_finite;
  local_108.prec_elem = 10;
  local_108.data._M_elems[0] = 0;
  local_108.data._M_elems[1] = 0;
  local_108.data._M_elems[2] = 0;
  local_108.data._M_elems[3] = 0;
  local_108.data._M_elems[4] = 0;
  local_108.data._M_elems[5] = 0;
  local_108.data._M_elems._24_5_ = 0;
  local_108.data._M_elems[7]._1_3_ = 0;
  local_108.data._M_elems._32_5_ = 0;
  local_108.data._M_elems[9]._1_3_ = 0;
  local_108.exp = 0;
  local_108.neg = false;
  local_88 = (this->l).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_90 = (this->l).idx;
  local_d0 = (this->l).row;
  local_80 = (this->l).start;
  local_120 = (ulong)(this->l).firstUpdate;
  if ((long)local_120 < 1) {
    local_120 = 0;
  }
  else {
    local_118 = 0;
    local_78 = vec;
    local_70 = this;
    do {
      iVar5 = local_d0[local_118];
      uVar3 = *(undefined8 *)(vec[iVar5].m_backend.data._M_elems + 8);
      local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.data._M_elems._0_8_ = *(undefined8 *)vec[iVar5].m_backend.data._M_elems;
      local_108.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar5].m_backend.data._M_elems + 2);
      puVar1 = vec[iVar5].m_backend.data._M_elems + 4;
      local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.exp = vec[iVar5].m_backend.exp;
      local_108.neg = vec[iVar5].m_backend.neg;
      local_108.fpclass = vec[iVar5].m_backend.fpclass;
      local_108.prec_elem = vec[iVar5].m_backend.prec_elem;
      if (local_108.fpclass == cpp_dec_float_NaN) {
LAB_002a8cdd:
        local_110 = (ulong)local_80[local_118];
        iVar5 = local_80[local_118 + 1];
        if (local_80[local_118] < iVar5) {
          pcVar11 = &local_88[local_110].m_backend;
          piVar6 = local_90 + local_110;
          do {
            local_158.fpclass = cpp_dec_float_finite;
            local_158.prec_elem = 10;
            local_158.data._M_elems[0] = 0;
            local_158.data._M_elems[1] = 0;
            local_158.data._M_elems[2] = 0;
            local_158.data._M_elems[3] = 0;
            local_158.data._M_elems[4] = 0;
            local_158.data._M_elems[5] = 0;
            local_158.data._M_elems[6] = 0;
            local_158.data._M_elems[7] = 0;
            local_158.data._M_elems[8] = 0;
            local_158.data._M_elems[9] = 0;
            local_158.exp = 0;
            local_158.neg = false;
            pcVar7 = &local_108;
            if (pcVar11 != &local_158) {
              local_158.data._M_elems[8] = local_108.data._M_elems[8];
              local_158.data._M_elems[9] =
                   (uint)(CONCAT35(local_108.data._M_elems[9]._1_3_,local_108.data._M_elems._32_5_)
                         >> 0x20);
              local_158.data._M_elems[4] = local_108.data._M_elems[4];
              local_158.data._M_elems[5] = local_108.data._M_elems[5];
              local_158.data._M_elems[6] = local_108.data._M_elems[6];
              local_158.data._M_elems[7] =
                   (uint)(CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_)
                         >> 0x20);
              local_158.data._M_elems[0] = local_108.data._M_elems[0];
              local_158.data._M_elems[1] = local_108.data._M_elems[1];
              local_158.data._M_elems[2] = local_108.data._M_elems[2];
              local_158.data._M_elems[3] = local_108.data._M_elems[3];
              local_158.exp = local_108.exp;
              local_158.neg = local_108.neg;
              local_158.fpclass = local_108.fpclass;
              local_158.prec_elem = local_108.prec_elem;
              pcVar7 = pcVar11;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_158,pcVar7);
            local_68.fpclass = cpp_dec_float_finite;
            local_68.prec_elem = 10;
            local_68.data._M_elems[0] = 0;
            local_68.data._M_elems[1] = 0;
            local_68.data._M_elems[2] = 0;
            local_68.data._M_elems[3] = 0;
            local_68.data._M_elems[4] = 0;
            local_68.data._M_elems[5] = 0;
            local_68.data._M_elems._24_5_ = 0;
            local_68.data._M_elems[7]._1_3_ = 0;
            local_68.data._M_elems._32_5_ = 0;
            local_68.data._M_elems[9]._1_3_ = 0;
            local_68.exp = 0;
            local_68.neg = false;
            pcVar7 = &local_108;
            if (pcVar11 != &local_68) {
              local_68.data._M_elems._32_5_ = local_108.data._M_elems._32_5_;
              local_68.data._M_elems[9]._1_3_ = local_108.data._M_elems[9]._1_3_;
              local_68.data._M_elems[4] = local_108.data._M_elems[4];
              local_68.data._M_elems[5] = local_108.data._M_elems[5];
              local_68.data._M_elems._24_5_ = local_108.data._M_elems._24_5_;
              local_68.data._M_elems[7]._1_3_ = local_108.data._M_elems[7]._1_3_;
              local_68.data._M_elems[0] = local_108.data._M_elems[0];
              local_68.data._M_elems[1] = local_108.data._M_elems[1];
              local_68.data._M_elems[2] = local_108.data._M_elems[2];
              local_68.data._M_elems[3] = local_108.data._M_elems[3];
              local_68.exp = local_108.exp;
              local_68.neg = local_108.neg;
              local_68.fpclass = local_108.fpclass;
              local_68.prec_elem = local_108.prec_elem;
              pcVar7 = pcVar11;
            }
            pcVar12 = &local_78[*piVar6].m_backend;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_68,pcVar7);
            local_c8.fpclass = cpp_dec_float_finite;
            local_c8.prec_elem = 10;
            local_c8.data._M_elems[0] = 0;
            local_c8.data._M_elems[1] = 0;
            local_c8.data._M_elems[2] = 0;
            local_c8.data._M_elems[3] = 0;
            local_c8.data._M_elems[4] = 0;
            local_c8.data._M_elems[5] = 0;
            local_c8.data._M_elems._24_5_ = 0;
            local_c8.data._M_elems[7]._1_3_ = 0;
            local_c8.data._M_elems._32_5_ = 0;
            local_c8.data._M_elems[9]._1_3_ = 0;
            local_c8.exp = 0;
            local_c8.neg = false;
            if (&local_c8 != pcVar12) {
              uVar3 = *(undefined8 *)((pcVar12->data)._M_elems + 8);
              local_c8.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_c8.data._M_elems._0_8_ = *(undefined8 *)(pcVar12->data)._M_elems;
              local_c8.data._M_elems._8_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 2);
              local_c8.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
              local_c8.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_c8.exp = *(int *)(&pcVar12->data + 1);
              local_c8.neg = *(bool *)((long)(&pcVar12->data + 1) + 4);
              local_c8._48_8_ = *(undefined8 *)((long)(&pcVar12->data + 1) + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_c8,&local_68);
            local_158.fpclass = cpp_dec_float_finite;
            local_158.prec_elem = 10;
            local_158.data._M_elems[0] = 0;
            local_158.data._M_elems[1] = 0;
            local_158.data._M_elems[2] = 0;
            local_158.data._M_elems[3] = 0;
            local_158.data._M_elems[4] = 0;
            local_158.data._M_elems[5] = 0;
            local_158.data._M_elems[6] = 0;
            local_158.data._M_elems[7] = 0;
            local_158.data._M_elems[8] = 0;
            local_158.data._M_elems[9] = 0;
            local_158.exp = 0;
            local_158.neg = false;
            pcVar7 = &local_108;
            if (pcVar11 != &local_158) {
              local_158.data._M_elems[8] = local_108.data._M_elems[8];
              local_158.data._M_elems[9] =
                   (uint)(CONCAT35(local_108.data._M_elems[9]._1_3_,local_108.data._M_elems._32_5_)
                         >> 0x20);
              local_158.data._M_elems[4] = local_108.data._M_elems[4];
              local_158.data._M_elems[5] = local_108.data._M_elems[5];
              local_158.data._M_elems[6] = local_108.data._M_elems[6];
              local_158.data._M_elems[7] =
                   (uint)(CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_)
                         >> 0x20);
              local_158.data._M_elems[0] = local_108.data._M_elems[0];
              local_158.data._M_elems[1] = local_108.data._M_elems[1];
              local_158.data._M_elems[2] = local_108.data._M_elems[2];
              local_158.data._M_elems[3] = local_108.data._M_elems[3];
              local_158.exp = local_108.exp;
              local_158.neg = local_108.neg;
              local_158.fpclass = local_108.fpclass;
              local_158.prec_elem = local_108.prec_elem;
              pcVar7 = pcVar11;
            }
            pcVar11 = pcVar11 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_158,pcVar7);
            vec = local_78;
            iVar10 = *piVar6;
            piVar6 = piVar6 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_78[iVar10].m_backend,&local_158);
            iVar5 = iVar5 + -1;
          } while ((int)local_110 < iVar5);
        }
      }
      else {
        local_158.fpclass = cpp_dec_float_finite;
        local_158.prec_elem = 10;
        local_158.data._M_elems[0] = 0;
        local_158.data._M_elems[1] = 0;
        local_158.data._M_elems[2] = 0;
        local_158.data._M_elems[3] = 0;
        local_158.data._M_elems[4] = 0;
        local_158.data._M_elems[5] = 0;
        local_158.data._M_elems[6] = 0;
        local_158.data._M_elems[7] = 0;
        local_158.data._M_elems[8] = 0;
        local_158.data._M_elems[9] = 0;
        local_158.exp = 0;
        local_158.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_158,0.0);
        iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_108,&local_158);
        if (iVar5 != 0) goto LAB_002a8cdd;
      }
      local_118 = local_118 + 1;
      this = local_70;
    } while (local_118 != local_120);
  }
  if ((this->l).updateType != 0) {
    uVar2 = (this->l).firstUnused;
    uVar9 = (ulong)uVar2;
    if ((int)local_120 < (int)uVar2) {
      local_110 = local_120 & 0xffffffff;
      local_118 = uVar9;
      do {
        iVar5 = local_80[local_110];
        lVar8 = (long)local_d0[local_110];
        local_158.data._M_elems[0] = vec[lVar8].m_backend.data._M_elems[0];
        local_158.data._M_elems[9] = vec[lVar8].m_backend.data._M_elems[9];
        puVar1 = vec[lVar8].m_backend.data._M_elems + 5;
        uVar3 = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_158.data._M_elems[5] = (uint)uVar3;
        local_158.data._M_elems[6] = (uint)((ulong)uVar3 >> 0x20);
        local_158.data._M_elems[7] = (uint)uVar4;
        local_158.data._M_elems[8] = (uint)((ulong)uVar4 >> 0x20);
        puVar1 = vec[lVar8].m_backend.data._M_elems + 1;
        uVar3 = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_158.data._M_elems[1] = (uint)uVar3;
        local_158.data._M_elems[2] = (uint)((ulong)uVar3 >> 0x20);
        local_158.data._M_elems[3] = (uint)uVar4;
        local_158.data._M_elems[4] = (uint)((ulong)uVar4 >> 0x20);
        local_158.exp = vec[lVar8].m_backend.exp;
        local_158.fpclass = vec[lVar8].m_backend.fpclass;
        local_158.neg =
             (bool)((local_158.data._M_elems[0] != 0 || local_158.fpclass != cpp_dec_float_finite) ^
                   vec[lVar8].m_backend.neg);
        local_158.prec_elem = vec[lVar8].m_backend.prec_elem;
        iVar10 = local_80[local_110 + 1];
        if (iVar5 < iVar10) {
          pcVar11 = &local_88[iVar5].m_backend;
          piVar6 = local_90 + iVar5;
          do {
            pcVar12 = &vec[*piVar6].m_backend;
            local_c8.fpclass = cpp_dec_float_finite;
            local_c8.prec_elem = 10;
            local_c8.data._M_elems[0] = 0;
            local_c8.data._M_elems[1] = 0;
            local_c8.data._M_elems[2] = 0;
            local_c8.data._M_elems[3] = 0;
            local_c8.data._M_elems[4] = 0;
            local_c8.data._M_elems[5] = 0;
            local_c8.data._M_elems._24_5_ = 0;
            local_c8.data._M_elems[7]._1_3_ = 0;
            local_c8.data._M_elems._32_5_ = 0;
            local_c8.data._M_elems[9]._1_3_ = 0;
            local_c8.exp = 0;
            local_c8.neg = false;
            pcVar7 = pcVar12;
            if ((pcVar11 != &local_c8) && (pcVar7 = pcVar11, &local_c8 != pcVar12)) {
              uVar3 = *(undefined8 *)((pcVar12->data)._M_elems + 8);
              local_c8.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_c8.data._M_elems._0_8_ = *(undefined8 *)(pcVar12->data)._M_elems;
              local_c8.data._M_elems._8_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 2);
              local_c8.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
              local_c8.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_c8.exp = pcVar12->exp;
              local_c8.neg = pcVar12->neg;
              local_c8.fpclass = pcVar12->fpclass;
              local_c8.prec_elem = pcVar12->prec_elem;
            }
            piVar6 = piVar6 + 1;
            pcVar11 = pcVar11 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_c8,pcVar7);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_158,&local_c8);
            iVar10 = iVar10 + -1;
          } while (iVar5 < iVar10);
          lVar8 = (long)local_d0[local_110];
          uVar9 = local_118;
        }
        local_110 = local_110 + 1;
        vec[lVar8].m_backend.data._M_elems[0] = local_158.data._M_elems[0];
        puVar1 = vec[lVar8].m_backend.data._M_elems + 1;
        *(ulong *)puVar1 = CONCAT44(local_158.data._M_elems[2],local_158.data._M_elems[1]);
        *(ulong *)(puVar1 + 2) = CONCAT44(local_158.data._M_elems[4],local_158.data._M_elems[3]);
        puVar1 = vec[lVar8].m_backend.data._M_elems + 5;
        *(ulong *)puVar1 = CONCAT44(local_158.data._M_elems[6],local_158.data._M_elems[5]);
        *(ulong *)(puVar1 + 2) = CONCAT44(local_158.data._M_elems[8],local_158.data._M_elems[7]);
        vec[lVar8].m_backend.data._M_elems[9] = local_158.data._M_elems[9];
        vec[lVar8].m_backend.exp = local_158.exp;
        vec[lVar8].m_backend.neg =
             (bool)((local_158.fpclass != cpp_dec_float_finite || local_158.data._M_elems[0] != 0) ^
                   local_158.neg);
        vec[lVar8].m_backend.fpclass = local_158.fpclass;
        vec[lVar8].m_backend.prec_elem = local_158.prec_elem;
      } while (local_110 != uVar9);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLright(R* vec)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = 0; i < end; ++i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);

         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            SPxOut::debug(this, "                         -> y{} -= {} * {} = {}    -> {}\n", *idx, x, *val,
                          x * (*val), vec[*idx] - x * (*val));
            vec[*idx++] -= x * (*val++);
         }
      }
   }

   if(l.updateType)                      /* Forest-Tomlin Updates */
   {
      SPxOut::debug(this, "performing FT updates...\n");

      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);
         StableSum<R> tmp(-vec[lrow[i]]);

         for(j = lbeg[i + 1]; j > k; --j)
            tmp += vec[*idx++] * (*val++);

         vec[lrow[i]] = -R(tmp);

         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);
      }

      SPxOut::debug(this, "finished FT updates.\n");
   }
}